

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

void readStartOfFrame(ifstream *inFile,Header *header)

{
  ColorComponent *pCVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 in_RAX;
  char cVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  ostream *poVar17;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading SOF Marker \n",0x14);
  if (header->numComponents == '\0') {
    iVar8 = std::istream::get();
    iVar9 = std::istream::get();
    cVar4 = std::istream::get();
    if (cVar4 != '\b') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"invalid precision :",0x13);
      uStack_38._0_3_ = CONCAT12(cVar4,(undefined2)uStack_38);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)((long)&uStack_38 + 2),1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      goto LAB_0010372e;
    }
    iVar10 = std::istream::get();
    iVar11 = std::istream::get();
    header->height = iVar11 + iVar10 * 0x100;
    iVar10 = std::istream::get();
    iVar11 = std::istream::get();
    uVar12 = iVar11 + iVar10 * 0x100;
    header->width = uVar12;
    uVar3 = header->height;
    header->mcuHeight = uVar3 + 7 >> 3;
    header->mcuWidth = uVar12 + 7 >> 3;
    header->mcuHeightReal = uVar3 + 7 >> 3;
    header->mcuWidthReal = uVar12 + 7 >> 3;
    if (uVar12 == 0 || uVar3 == 0) {
      pcVar16 = "zero width or height\n";
LAB_001037f8:
      poVar17 = (ostream *)&std::cout;
      lVar14 = 0x15;
    }
    else {
      bVar5 = std::istream::get();
      header->numComponents = bVar5;
      if (bVar5 == '\0') {
        poVar17 = (ostream *)&std::cout;
        pcVar16 = "number of color components must not be zero";
        lVar14 = 0x2b;
      }
      else if (bVar5 == '\x04') {
        poVar17 = (ostream *)&std::cout;
        pcVar16 = "not support CMYK color mode";
        lVar14 = 0x1b;
      }
      else {
        uStack_38 = CONCAT44(8 - (iVar8 * 0x100 + iVar9),(undefined4)uStack_38);
        uVar15 = 0;
        while( true ) {
          cVar4 = std::istream::get();
          if (cVar4 == '\0') {
            header->zeroBased = true;
            cVar13 = '\x01';
          }
          else {
            cVar13 = header->zeroBased;
          }
          bVar6 = cVar4 + cVar13;
          if (bVar6 - 4 < 0xfffffffd) break;
          if (header->colorComponent[bVar6 - 1].used == true) {
            pcVar16 = "used color components";
            goto LAB_001037f8;
          }
          pCVar1 = header->colorComponent + (bVar6 - 1);
          pCVar1->used = true;
          bVar7 = std::istream::get();
          pCVar1->horizontalSamplingFactor = bVar7 >> 4;
          pCVar1->verticalSamplingFactor = bVar7 & 0xf;
          bVar7 = std::istream::get();
          pCVar1->quantizationTableID = bVar7;
          bVar5 = pCVar1->horizontalSamplingFactor;
          if (bVar6 == 1) {
            bVar2 = pCVar1->verticalSamplingFactor;
            if (bVar5 != '\x01') {
              if (bVar5 != '\x02' && 1 < (byte)(bVar2 - 1)) goto LAB_001039b6;
              if ((bVar5 == '\x02') && ((header->mcuWidth & 1) != 0)) {
                header->mcuWidthReal = header->mcuWidthReal + 1;
              }
            }
            header->horizontalSamplingFactor = bVar5;
            header->verticalSamplingFactor = bVar2;
          }
          else if ((bVar5 != '\x01') || (pCVar1->verticalSamplingFactor != '\x01')) {
LAB_001039b6:
            poVar17 = (ostream *)&std::cout;
            pcVar16 = "only support samplingFacotor that is 1";
            lVar14 = 0x26;
            goto LAB_00103729;
          }
          if (3 < bVar7) {
            poVar17 = (ostream *)&std::cout;
            pcVar16 = "not valid quantization talbe id";
            lVar14 = 0x1f;
            goto LAB_00103729;
          }
          bVar6 = header->numComponents;
          if ((uint)bVar6 + (uint)bVar6 * 2 + uStack_38._4_4_ != 0) {
            pcVar16 = "not consistent length";
            goto LAB_001037f8;
          }
          uVar15 = uVar15 + 1;
          if (bVar6 <= uVar15) {
            return;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"not supported componentID:",0x1a);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        pcVar16 = (char *)((long)&uStack_38 + 3);
        uStack_38._0_4_ = CONCAT13(10,(undefined3)uStack_38);
        lVar14 = 1;
      }
    }
  }
  else {
    poVar17 = (ostream *)&std::cout;
    pcVar16 = "Error mutiple SOFs\n";
    lVar14 = 0x13;
  }
LAB_00103729:
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar16,lVar14);
LAB_0010372e:
  header->valid = false;
  return;
}

Assistant:

void readStartOfFrame(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading SOF Marker \n";
	//there can be only one SOF marker per JPEG file
	
	if (header->numComponents != 0) {
		std::cout << "Error mutiple SOFs\n";
		header->valid = false;
		return;
	}

	uint length = (inFile.get() << 8) + inFile.get();
	byte precision = inFile.get();

	//只支持8位的数据
	if (precision != 8) {
		std::cout << "invalid precision :" << precision << std::endl;
		header->valid = false;
		return;
	}

	header->height = (inFile.get() << 8) + inFile.get();
	header->width = (inFile.get() << 8) + inFile.get();

	header->mcuHeight = (header->height + 7) / 8;
	header->mcuWidth = (header->width + 7) / 8;

	header->mcuHeightReal = header->mcuHeight;
	header->mcuWidthReal = header->mcuWidth;

	if (header->height == 0 || header->width == 0) {
		std::cout << "zero width or height\n";
		header->valid = false;
		return;
	}
	
	header->numComponents = inFile.get();
	if (header->numComponents == 4) {
		std::cout << "not support CMYK color mode";
		header->valid = false;
		return;
	}

	if (header->numComponents == 0) {
		std::cout << "number of color components must not be zero";
		header->valid = false;
		return;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		byte componentID = inFile.get();
		/*
			usually 1 2 3, but 0 1 2 is possible ,always force them into 1 2 3
			Y(1), 2(Cb), 3(Cr)
		*/
		if (componentID == 0) {
			header->zeroBased = true;
		}

		if (header->zeroBased) {
			componentID += 1;
		}

		if (componentID == 0 || componentID > 3) {
			std::cout << "not supported componentID:" << (uint)componentID << '\n';
			header->valid = false;
			return;
		}

		ColorComponent* component = &(header->colorComponent[componentID - 1]);
		if (component->used) {
			std::cout << "used color components";
			header->valid = false;
			return;
		}

		component->used = true;
		byte samplingFactor = inFile.get();
		component->horizontalSamplingFactor = samplingFactor >> 4;
		component->verticalSamplingFactor = samplingFactor & 0x0F;
		component->quantizationTableID = inFile.get();

		//lunimance channel
		//只支持1 或者 2
		//horizontal 2的话 代表读取y0 y1, cb cr
		//如果vertical 也2的话, 代表读取 y0 y1 y2 y3 cb cr
		if	(componentID == 1) {

			if (component->horizontalSamplingFactor != 1 && component->verticalSamplingFactor != 2 &&component->verticalSamplingFactor != 1 && component->horizontalSamplingFactor != 2) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}

			if(component->horizontalSamplingFactor == 2 && header->mcuWidth % 2 == 1) {
				header->mcuWidthReal++;
			}

			if(component->verticalSamplingFactor == 2 && header->mcuHeight % 2 == 1) {
				header->verticalSamplingFactor++;
			}

			header->horizontalSamplingFactor = component->horizontalSamplingFactor;
			header->verticalSamplingFactor = component->verticalSamplingFactor;
		} else { 
			//cb cr在一个mcu中永远是一个
			if (component->horizontalSamplingFactor != 1 || component->verticalSamplingFactor != 1) {
				std::cout << "only support samplingFacotor that is 1";
				header->valid = false;
				return;
			}
		}


		if (component->quantizationTableID > 3) {
			std::cout << "not valid quantization talbe id";
			header->valid = false;
			return;
		}
		//8是length2byte 加上 1byte sample precision 2bytes的 height 2 bytes的width  1byte的components                
		if (length - 8 - (3 * header->numComponents) != 0) {
			std::cout << "not consistent length";
			header->valid = false;
			return;
		}
	}
}